

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_IsInst<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var pvVar1;
  Var aClass;
  IsInstInlineCache *inlineCache_00;
  ScriptContext *scriptContext_00;
  Var result;
  ScriptContext *scriptContext;
  IsInstInlineCache *inlineCache;
  Var function;
  Var instance;
  OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar1 = GetReg<unsigned_int>(this,playout->R1);
  aClass = GetReg<unsigned_int>(this,playout->R2);
  inlineCache_00 = GetIsInstInlineCache(this,playout->inlineCacheIndex);
  scriptContext_00 = GetScriptContext(this);
  pvVar1 = Js::JavascriptOperators::OP_IsInst(pvVar1,aClass,scriptContext_00,inlineCache_00);
  SetReg<unsigned_int>(this,playout->R0,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_IsInst(const unaligned T* playout)
    {
        Var instance = GetReg(playout->R1);
        Var function = GetReg(playout->R2);
        IsInstInlineCache *inlineCache = this->GetIsInstInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();

        Var result = JavascriptOperators::OP_IsInst(instance, function, scriptContext, inlineCache);

#ifdef ENABLE_BASIC_TELEMETRY
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().IsInstanceOf(instance, function, result);
        }
#endif

        SetReg(playout->R0, result);
    }